

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

void __thiscall
glcts::InterfaceMatchingCaseInt::generateVarLinkFragmentShaderSrc
          (InterfaceMatchingCaseInt *this,string *outFragSrc,GLSLVersion glslVersion,
          string *precision,TestType testMode)

{
  char *pcVar1;
  ostream *poVar2;
  string local_1d8 [48];
  undefined1 local_1a8 [8];
  ostringstream fragSrc;
  TestType testMode_local;
  string *precision_local;
  GLSLVersion glslVersion_local;
  string *outFragSrc_local;
  InterfaceMatchingCaseInt *this_local;
  
  fragSrc._372_4_ = testMode;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar1 = glu::getGLSLVersionDeclaration(glslVersion);
  poVar2 = std::operator<<((ostream *)local_1a8,pcVar1);
  std::operator<<(poVar2,"\n");
  if (fragSrc._372_4_ != 0) {
    if (fragSrc._372_4_ != 1) {
      if (fragSrc._372_4_ == 2) {
        poVar2 = std::operator<<((ostream *)local_1a8,"flat in ");
        poVar2 = std::operator<<(poVar2,(string *)precision);
        std::operator<<(poVar2," int var;\n");
      }
      goto LAB_013e2f92;
    }
    poVar2 = std::operator<<((ostream *)local_1a8,"precision ");
    poVar2 = std::operator<<(poVar2,(string *)precision);
    std::operator<<(poVar2," int;\n");
  }
  std::operator<<((ostream *)local_1a8,"flat in int var;\n");
LAB_013e2f92:
  std::operator<<((ostream *)local_1a8,"layout(location = 0) out mediump vec4 o_color;\n");
  std::operator<<((ostream *)local_1a8,"void main (void)\n");
  std::operator<<((ostream *)local_1a8,"{\n");
  std::operator<<((ostream *)local_1a8,"    o_color = vec4(var);\n");
  std::operator<<((ostream *)local_1a8,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)outFragSrc,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  return;
}

Assistant:

void generateVarLinkFragmentShaderSrc(std::string& outFragSrc, glu::GLSLVersion glslVersion,
										  const string& precision, TestType testMode)
	{
		std::ostringstream fragSrc;
		fragSrc << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
		switch (testMode)
		{
		case SET_DEFAULT_PRECISION:
			fragSrc << "precision " << precision << " int;\n";
		case DEFAULT_PRECISION:
			fragSrc << "flat in int var;\n";
			break;
		case SET_PRECISION:
			fragSrc << "flat in " << precision << " int var;\n";
			break;
		}
		fragSrc << "layout(location = 0) out mediump vec4 o_color;\n";
		fragSrc << "void main (void)\n";
		fragSrc << "{\n";
		fragSrc << "    o_color = vec4(var);\n";
		fragSrc << "}\n";
		outFragSrc = fragSrc.str();
	}